

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::ReadLinearExpr<mp::BasicProblem<mp::BasicProblemParams<int>>::LinearExprBuilder>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           *this,int num_terms,LinearExprBuilder linear_expr)

{
  uint in_ESI;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_RDI;
  double coef;
  int var_index;
  int i;
  int in_stack_ffffffffffffffcc;
  int local_18;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *this_00;
  
  this_00 = in_RDI;
  for (local_18 = 0; local_18 < (int)in_ESI; local_18 = local_18 + 1) {
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    ::ReadUInt(this_00,in_ESI);
    BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
              ((BinaryReader<mp::internal::EndiannessConverter> *)in_RDI);
    BinaryReaderBase::ReadTillEndOfLine
              ((BinaryReaderBase *)(((BinaryReaderBase *)&in_RDI->reader_)->super_ReaderBase).ptr_);
    BasicProblem<mp::BasicProblemParams<int>_>::LinearExprBuilder::AddTerm
              ((LinearExprBuilder *)in_RDI,in_stack_ffffffffffffffcc,2.53118525919837e-317);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}